

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

void __thiscall
duckdb::SetCommentInfo::SetCommentInfo
          (SetCommentInfo *this,CatalogType entry_catalog_type,string *entry_catalog_p,
          string *entry_schema_p,string *entry_name_p,Value *new_comment_value_p,
          OnEntryNotFound if_not_found)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (entry_catalog_p->_M_dataplus)._M_p;
  paVar1 = &entry_catalog_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&entry_catalog_p->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70._M_string_length = entry_catalog_p->_M_string_length;
  (entry_catalog_p->_M_dataplus)._M_p = (pointer)paVar1;
  entry_catalog_p->_M_string_length = 0;
  (entry_catalog_p->field_2)._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (entry_schema_p->_M_dataplus)._M_p;
  paVar1 = &entry_schema_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&entry_schema_p->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_90._M_string_length = entry_schema_p->_M_string_length;
  (entry_schema_p->_M_dataplus)._M_p = (pointer)paVar1;
  entry_schema_p->_M_string_length = 0;
  (entry_schema_p->field_2)._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (entry_name_p->_M_dataplus)._M_p;
  paVar1 = &entry_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&entry_name_p->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50._M_string_length = entry_name_p->_M_string_length;
  (entry_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  entry_name_p->_M_string_length = 0;
  (entry_name_p->field_2)._M_local_buf[0] = '\0';
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,SET_COMMENT,&local_70,&local_90,&local_50,if_not_found);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetCommentInfo_01980b80;
  (this->super_AlterInfo).field_0x71 = entry_catalog_type;
  Value::Value(&this->comment_value,new_comment_value_p);
  return;
}

Assistant:

SetCommentInfo::SetCommentInfo(CatalogType entry_catalog_type, string entry_catalog_p, string entry_schema_p,
                               string entry_name_p, Value new_comment_value_p, OnEntryNotFound if_not_found)
    : AlterInfo(AlterType::SET_COMMENT, std::move(entry_catalog_p), std::move(entry_schema_p), std::move(entry_name_p),
                if_not_found),
      entry_catalog_type(entry_catalog_type), comment_value(std::move(new_comment_value_p)) {
}